

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> *
__thiscall
cmUVProcessChain::GetStatus
          (vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
           *__return_storage_ptr__,cmUVProcessChain *this)

{
  pointer pIVar1;
  size_type sVar2;
  Status *pSVar3;
  reference ppSVar4;
  ulong local_48;
  size_t i;
  allocator<const_cmUVProcessChain::Status_*> local_29;
  value_type local_28;
  undefined1 local_19;
  cmUVProcessChain *local_18;
  cmUVProcessChain *this_local;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
  *statuses;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmUVProcessChain *)__return_storage_ptr__;
  pIVar1 = std::
           unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
           ::operator->(&this->Data);
  sVar2 = std::
          vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
          ::size(&pIVar1->Processes);
  local_28 = (value_type)0x0;
  std::allocator<const_cmUVProcessChain::Status_*>::allocator(&local_29);
  std::vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>::
  vector(__return_storage_ptr__,sVar2,&local_28,&local_29);
  std::allocator<const_cmUVProcessChain::Status_*>::~allocator(&local_29);
  for (local_48 = 0;
      sVar2 = std::
              vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ::size(__return_storage_ptr__), local_48 < sVar2; local_48 = local_48 + 1) {
    pSVar3 = GetStatus(this,local_48);
    ppSVar4 = std::
              vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ::operator[](__return_storage_ptr__,local_48);
    *ppSVar4 = pSVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const cmUVProcessChain::Status*> cmUVProcessChain::GetStatus()
  const
{
  std::vector<const cmUVProcessChain::Status*> statuses(
    this->Data->Processes.size(), nullptr);
  for (std::size_t i = 0; i < statuses.size(); i++) {
    statuses[i] = this->GetStatus(i);
  }
  return statuses;
}